

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

int fprint<char_const*,std::__cxx11::string>
              (FILE *out,char *fmt,char **args,
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  char *__ptr;
  size_type __size;
  size_t sVar1;
  undefined1 local_48 [8];
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char **args_local;
  char *fmt_local;
  FILE *out_local;
  
  str.field_2._8_8_ = args_1;
  stringformat<char_const*,std::__cxx11::string>((string *)local_48,fmt,args,args_1);
  __ptr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    ((string *)local_48);
  __size = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                     ((string *)local_48);
  sVar1 = fwrite(__ptr,__size,1,(FILE *)out);
  std::__cxx11::string::~string((string *)local_48);
  return (int)sVar1;
}

Assistant:

int fprint(FILE *out, const char *fmt, ARGS&&...args)
{
    auto str = stringformat(fmt, std::forward<ARGS>(args)...);
    return fwrite(str.c_str(), str.size(), 1, out);
}